

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void arm_tr_init_disas_context(DisasContextBase *dcbase,CPUState *cs)

{
  uint uVar1;
  uc_struct_conflict7 *puVar2;
  TCGContext_conflict6 *s;
  void *pvVar3;
  ulong uVar4;
  ulong uVar5;
  byte bVar6;
  int iVar7;
  TCGTemp *pTVar8;
  undefined1 uVar9;
  byte bVar10;
  uint uVar11;
  DisasJumpType DVar12;
  
  puVar2 = cs->uc;
  s = puVar2->tcg_ctx;
  pvVar3 = cs->env_ptr;
  uVar1 = dcbase->tb->flags;
  dcbase[8].pc_next = (target_ulong)puVar2;
  dcbase[1].tb = (TranslationBlock *)((long)pvVar3 + 0x3238);
  dcbase[1].num_insns = 0;
  dcbase[3].num_insns = 0;
  uVar4 = *(ulong *)((long)pvVar3 + 0x3030);
  *(bool *)((long)&dcbase[3].tb + 4) = (uVar4 & 0x210000000) == 0x200000000;
  *(uint *)&dcbase[2].pc_first = uVar1 >> 8 & 1;
  uVar11 = uVar1 >> 0x19 & 8;
  *(uint *)&dcbase[2].pc_next = uVar11;
  *(uint *)&dcbase[2].tb = uVar1 * 2 & 0x1e;
  *(uint *)((long)&dcbase[2].tb + 4) = (uVar1 & 0xff) >> 4;
  DVar12 = 0x40;
  if (((uint)uVar4 >> 9 & 1) == 0) {
    DVar12 = 0x10;
  }
  DVar12 = DVar12 | uVar1 >> 0x18 & (DISAS_TARGET_11|DISAS_TOO_MANY);
  dcbase[2].is_jmp = DVar12;
  iVar7 = arm_mmu_idx_to_el_aarch64(DVar12);
  dcbase[3].max_insns = iVar7;
  *(uint *)((long)&dcbase[2].pc_next + 4) = (uint)(iVar7 == 0);
  dcbase[2].max_insns = uVar1 >> 0x16 & 3;
  uVar4 = *(ulong *)((long)pvVar3 + 0x3030);
  if (((uint)uVar4 >> 9 & 1) == 0) {
    *(uint *)&dcbase[2].pc_next = uVar11;
    *(uint *)&dcbase[3].singlestep_enabled = uVar1 >> 0x14 & 3;
    *(uint *)((long)&dcbase[2].pc_first + 4) = uVar1 >> 0xf & 1;
    *(byte *)((long)&dcbase[4].pc_next + 7) = (byte)(uVar1 >> 0x10) & 1;
    *(byte *)((long)&dcbase[2].num_insns + 2) = (byte)(uVar1 >> 0x11) & 1;
    *(byte *)((long)&dcbase[3].tb + 5) = (byte)(uVar1 >> 0xe) & 1;
    if ((uVar4 & 2) == 0) {
      *(uint *)&dcbase[3].pc_first = uVar1 >> 9 & 7;
      *(uint *)((long)&dcbase[3].pc_first + 4) = uVar1 >> 0xc & 3;
    }
    else {
      dcbase[4].num_insns = uVar1 >> 0xc & 3;
    }
  }
  else {
    *(undefined1 *)((long)&dcbase[3].tb + 5) = 1;
    *(undefined4 *)&dcbase[2].pc_next = 0;
    *(byte *)&dcbase[3].pc_next = (byte)(uVar1 >> 9) & 1;
    if ((uVar4 >> 0x25 & 1) == 0) {
      uVar9 = 0;
    }
    else {
      uVar11 = dcbase[2].is_jmp - 0x10;
      if ((0x37 < uVar11) || ((0xff000000070fffU >> ((ulong)uVar11 & 0x3f) & 1) == 0)) {
        g_assertion_message_expr
                  ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/internals.h"
                   ,0x37c,(char *)0x0);
      }
      uVar9 = (&DAT_00d76b58)[uVar11];
    }
    *(undefined1 *)((long)&dcbase[3].pc_next + 1) = uVar9;
    *(byte *)((long)&dcbase[3].pc_next + 2) = (byte)(uVar1 >> 10) & 1;
    *(byte *)((long)&dcbase[3].pc_next + 3) = (byte)(uVar1 >> 0xd) & 1;
    *(byte *)((long)&dcbase[3].pc_next + 4) = (byte)(uVar1 >> 0xc) & 1;
    *(byte *)((long)&dcbase[3].pc_next + 5) = (byte)(uVar1 >> 0xb) & 1;
  }
  dcbase[4].tb = *(TranslationBlock **)((long)pvVar3 + 0x31c0);
  dcbase[4].pc_first = uVar4;
  bVar6 = (byte)(uVar1 >> 0x18);
  bVar10 = bVar6 >> 6 & 1;
  *(byte *)((long)&dcbase[4].pc_next + 1) = bVar10;
  *(byte *)((long)&dcbase[4].pc_next + 2) = bVar6 >> 5 & 1;
  *(undefined1 *)((long)&dcbase[4].pc_next + 3) = 0;
  uVar4 = dcbase->pc_first;
  uVar5 = *(ulong *)&puVar2->init_target_page->mask;
  dcbase[1].pc_next = uVar5 & uVar4;
  if ((bVar10 | dcbase->singlestep_enabled) == 1) {
    dcbase->max_insns = 1;
  }
  if ((int)dcbase[2].pc_first == 0) {
    iVar7 = (int)(-(uVar5 | uVar4) >> 2);
    if (dcbase->max_insns < iVar7) {
      iVar7 = dcbase->max_insns;
    }
    dcbase->max_insns = iVar7;
  }
  pTVar8 = tcg_temp_new_internal_aarch64((TCGContext_conflict1 *)s,TCG_TYPE_I64,false);
  s->cpu_V0 = (TCGv_i64)((long)pTVar8 - (long)s);
  pTVar8 = tcg_temp_new_internal_aarch64((TCGContext_conflict1 *)s,TCG_TYPE_I64,false);
  s->cpu_V1 = (TCGv_i64)((long)pTVar8 - (long)s);
  pTVar8 = tcg_temp_new_internal_aarch64((TCGContext_conflict1 *)s,TCG_TYPE_I64,false);
  s->cpu_M0 = (TCGv_i64)((long)pTVar8 - (long)s);
  return;
}

Assistant:

static void arm_tr_init_disas_context(DisasContextBase *dcbase, CPUState *cs)
{
    DisasContext *dc = container_of(dcbase, DisasContext, base);
    struct uc_struct *uc = cs->uc;
    TCGContext *tcg_ctx = cs->uc->tcg_ctx;
    CPUARMState *env = cs->env_ptr;
    ARMCPU *cpu = env_archcpu(env);
    uint32_t tb_flags = dc->base.tb->flags;
    uint32_t condexec, core_mmu_idx;

    // unicorn handle
    dc->uc = uc;
    dc->isar = &cpu->isar;
    dc->condjmp = 0;

    dc->aarch64 = 0;
    /* If we are coming from secure EL0 in a system with a 32-bit EL3, then
     * there is no secure EL1, so we route exceptions to EL3.
     */
    dc->secure_routed_to_el3 = arm_feature(env, ARM_FEATURE_EL3) &&
                               !arm_el_is_aa64(env, 3);
    dc->thumb = FIELD_EX32(tb_flags, TBFLAG_AM32, THUMB);
    dc->be_data = FIELD_EX32(tb_flags, TBFLAG_ANY, BE_DATA) ? MO_BE : MO_LE;
    condexec = FIELD_EX32(tb_flags, TBFLAG_AM32, CONDEXEC);
    dc->condexec_mask = (condexec & 0xf) << 1;
    dc->condexec_cond = condexec >> 4;

    core_mmu_idx = FIELD_EX32(tb_flags, TBFLAG_ANY, MMUIDX);
    dc->mmu_idx = core_to_arm_mmu_idx(env, core_mmu_idx);
    dc->current_el = arm_mmu_idx_to_el(dc->mmu_idx);
    dc->user = (dc->current_el == 0);
    dc->fp_excp_el = FIELD_EX32(tb_flags, TBFLAG_ANY, FPEXC_EL);

    if (arm_feature(env, ARM_FEATURE_M)) {
        dc->vfp_enabled = 1;
        dc->be_data = MO_TE;
        dc->v7m_handler_mode = FIELD_EX32(tb_flags, TBFLAG_M32, HANDLER);
        dc->v8m_secure = arm_feature(env, ARM_FEATURE_M_SECURITY) &&
            regime_is_secure(env, dc->mmu_idx);
        dc->v8m_stackcheck = FIELD_EX32(tb_flags, TBFLAG_M32, STACKCHECK);
        dc->v8m_fpccr_s_wrong =
            FIELD_EX32(tb_flags, TBFLAG_M32, FPCCR_S_WRONG);
        dc->v7m_new_fp_ctxt_needed =
            FIELD_EX32(tb_flags, TBFLAG_M32, NEW_FP_CTXT_NEEDED);
        dc->v7m_lspact = FIELD_EX32(tb_flags, TBFLAG_M32, LSPACT);
    } else {
        dc->be_data =
            FIELD_EX32(tb_flags, TBFLAG_ANY, BE_DATA) ? MO_BE : MO_LE;
        dc->debug_target_el =
            FIELD_EX32(tb_flags, TBFLAG_ANY, DEBUG_TARGET_EL);
        dc->sctlr_b = FIELD_EX32(tb_flags, TBFLAG_A32, SCTLR_B);
        dc->hstr_active = FIELD_EX32(tb_flags, TBFLAG_A32, HSTR_ACTIVE);
        dc->ns = FIELD_EX32(tb_flags, TBFLAG_A32, NS);
        dc->vfp_enabled = FIELD_EX32(tb_flags, TBFLAG_A32, VFPEN);
        if (arm_feature(env, ARM_FEATURE_XSCALE)) {
            dc->c15_cpar = FIELD_EX32(tb_flags, TBFLAG_A32, XSCALE_CPAR);
        } else {
            dc->vec_len = FIELD_EX32(tb_flags, TBFLAG_A32, VECLEN);
            dc->vec_stride = FIELD_EX32(tb_flags, TBFLAG_A32, VECSTRIDE);
        }
    }
    dc->cp_regs = cpu->cp_regs;
    dc->features = env->features;

    /* Single step state. The code-generation logic here is:
     *  SS_ACTIVE == 0:
     *   generate code with no special handling for single-stepping (except
     *   that anything that can make us go to SS_ACTIVE == 1 must end the TB;
     *   this happens anyway because those changes are all system register or
     *   PSTATE writes).
     *  SS_ACTIVE == 1, PSTATE.SS == 1: (active-not-pending)
     *   emit code for one insn
     *   emit code to clear PSTATE.SS
     *   emit code to generate software step exception for completed step
     *   end TB (as usual for having generated an exception)
     *  SS_ACTIVE == 1, PSTATE.SS == 0: (active-pending)
     *   emit code to generate a software step exception
     *   end the TB
     */
    dc->ss_active = FIELD_EX32(tb_flags, TBFLAG_ANY, SS_ACTIVE);
    dc->pstate_ss = FIELD_EX32(tb_flags, TBFLAG_ANY, PSTATE_SS);
    dc->is_ldex = false;

    dc->page_start = dc->base.pc_first & TARGET_PAGE_MASK;

    /* If architectural single step active, limit to 1.  */
    if (is_singlestepping(dc)) {
        dc->base.max_insns = 1;
    }

    /* ARM is a fixed-length ISA.  Bound the number of insns to execute
       to those left on the page.  */
    if (!dc->thumb) {
#ifdef _MSC_VER
        int bound = (0 - (dc->base.pc_first | TARGET_PAGE_MASK)) / 4;
#else
        int bound = -(dc->base.pc_first | TARGET_PAGE_MASK) / 4;
#endif
        dc->base.max_insns = MIN(dc->base.max_insns, bound);
    }

    tcg_ctx->cpu_V0 = tcg_temp_new_i64(tcg_ctx);
    tcg_ctx->cpu_V1 = tcg_temp_new_i64(tcg_ctx);
    /* FIXME: cpu_M0 can probably be the same as cpu_V0.  */
    tcg_ctx->cpu_M0 = tcg_temp_new_i64(tcg_ctx);
}